

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_parse.cpp
# Opt level: O3

char * __thiscall FParser::GetTokens(FParser *this,char *s)

{
  byte bVar1;
  char *pcVar2;
  ulong uVar3;
  size_t sVar4;
  byte *pbVar5;
  uint uVar6;
  ulong uVar7;
  byte bVar8;
  uint uVar9;
  byte *__s;
  
  this->Rover = s;
  this->NumTokens = 1;
  *this->Tokens[0] = '\0';
  this->TokenType[(long)this->NumTokens + -1] = name_;
  this->Section = (DFsSection *)0x0;
  NextToken(this);
  this->LineStart = this->Rover;
  uVar6 = this->NumTokens;
  uVar7 = (ulong)uVar6;
  if (*this->Rover != '\0') {
    uVar3 = (ulong)(int)uVar6;
    __s = (byte *)this->Tokens[uVar3 - 1];
    if (this->Section == (DFsSection *)0x0) {
LAB_0050ef59:
      uVar6 = (uint)uVar7;
      pbVar5 = (byte *)this->Rover;
      if (this->TokenType[uVar3 - 1] == string_) {
switchD_0050ef89_caseD_4:
        do {
          bVar8 = *pbVar5;
          if (bVar8 == 0x5c) {
            this->Rover = (char *)(pbVar5 + 1);
            bVar8 = pbVar5[1];
            if ((byte)(bVar8 - 0x30) < 10) {
              sVar4 = strlen((char *)__s);
              (__s + sVar4)[0] = 0x1c;
              (__s + sVar4)[1] = 0;
              bVar8 = *this->Rover + 0x11;
            }
            else if (0x60 < bVar8) {
              if (bVar8 == 0x61) {
                bVar8 = 7;
              }
              else if (bVar8 == 0x6e) {
                bVar8 = 10;
              }
              else if (bVar8 == 0x74) {
                bVar8 = 9;
              }
            }
          }
          else if (bVar8 == 0x22) goto code_r0x0050f086;
          sVar4 = strlen((char *)__s);
          __s[sVar4] = bVar8;
          __s[sVar4 + 1] = 0;
          pbVar5 = (byte *)(this->Rover + 1);
          this->Rover = (char *)pbVar5;
        } while( true );
      }
      bVar8 = *pbVar5;
      uVar9 = (uint)(char)bVar8;
      if (uVar9 != 0x3b) {
        switch(this->TokenType[uVar3 - 1]) {
        case name_:
          if (bVar8 == 0x5f) goto LAB_0050efad;
          while ((0xfffffff5 < uVar9 - 0x3a || (0xffffffe5 < (uVar9 & 0xffffffdf) - 0x5b))) {
LAB_0050efad:
            do {
              this->Rover = (char *)(pbVar5 + 1);
              bVar8 = *pbVar5;
              sVar4 = strlen((char *)__s);
              __s[sVar4] = bVar8;
              __s[sVar4 + 1] = 0;
              pbVar5 = (byte *)this->Rover;
              uVar9 = (uint)(char)*pbVar5;
            } while (uVar9 == 0x5f);
          }
          break;
        case number:
          if (bVar8 == 0x2e || (byte)(bVar8 - 0x30) < 10) {
            do {
              this->Rover = (char *)(pbVar5 + 1);
              bVar8 = *pbVar5;
              sVar4 = strlen((char *)__s);
              __s[sVar4] = bVar8;
              __s[sVar4 + 1] = 0;
              pbVar5 = (byte *)this->Rover;
            } while (*pbVar5 == 0x2e || (byte)(*pbVar5 - 0x30) < 10);
          }
          break;
        case operator_:
          bVar1 = *__s;
          if (bVar1 != 0) {
            if (((bVar1 & 0xfe) == 0x28) || (bVar8 != 0x3d && bVar8 != bVar1)) break;
          }
          sVar4 = strlen((char *)__s);
          __s[sVar4] = bVar8;
          __s[sVar4 + 1] = 0;
          pbVar5 = (byte *)this->Rover;
        default:
          this->Rover = (char *)(pbVar5 + 1);
          goto LAB_0050f095;
        case unset:
          goto switchD_0050ef89_caseD_4;
        }
        goto LAB_0050f08d;
      }
    }
LAB_0050ef28:
    if ((__s != (byte *)0x0) && (*__s != 0)) goto LAB_0050ef3b;
  }
  this->NumTokens = uVar6 - 1;
LAB_0050ef3b:
  pcVar2 = this->Rover;
  this->Rover = pcVar2 + 1;
  return pcVar2 + 1;
code_r0x0050f086:
  this->Rover = (char *)(pbVar5 + 1);
LAB_0050f08d:
  NextToken(this);
LAB_0050f095:
  uVar6 = this->NumTokens;
  uVar7 = (ulong)(int)uVar6;
  __s = (byte *)this->Tokens[uVar7 - 1];
  uVar3 = uVar7;
  if (this->Section != (DFsSection *)0x0) goto LAB_0050ef28;
  goto LAB_0050ef59;
}

Assistant:

char *FParser::GetTokens(char *s)
{
	char *tokn = NULL;

	Rover = s;
	NumTokens = 1;
	Tokens[0][0] = 0; TokenType[NumTokens-1] = name_;
	
	Section = NULL;   // default to no section found
	
	NextToken();
	LineStart = Rover;      // save the start
	
	if(*Rover)
	{
		while(1)
		{
			tokn = Tokens[NumTokens-1];
			if(Section)
			{
				// a { or } section brace has been found
				break;        // stop parsing now
			}
			else if(TokenType[NumTokens-1] != string_)
			{
				if(*Rover == ';') break;     // check for end of command ';'
			}
			
			switch(TokenType[NumTokens-1])
			{
			case unset:
			case string_:
				while(*Rover != '\"')     // dedicated loop for speed
				{
					if(*Rover == '\\')       // escape sequences
					{
						Rover++;
						if (*Rover>='0' && *Rover<='9')
						{
							add_char(tokn, TEXTCOLOR_ESCAPE);
							add_char(tokn, *Rover+'A'-'0');
						}
						else add_char(tokn, escape_sequence(*Rover));
					}
					else
						add_char(tokn, *Rover);
					Rover++;
				}
				Rover++;
				NextToken();       // end of this token
				continue;
				
			case operator_:
				// all 2-character operators either end in '=' or
				// are 2 of the same character
				// do not allow 2-characters for brackets '(' ')'
				// which are still being considered as operators
				
				// operators are only 2-char max, do not need
				// a seperate loop
				
				if((*tokn && *Rover != '=' && *Rover!=*tokn) ||
					*tokn == '(' || *tokn == ')')
				{
					// end of operator
					NextToken();
					continue;
				}
				add_char(tokn, *Rover);
				break;
				
			case number:
				
				// haleyjd: 8-17
				// add while number chars are read
				
				while(isnum(*Rover))       // dedicated loop
					add_char(tokn, *Rover++);
				NextToken();
				continue;
				
			case name_:
				
				// add the chars
				
				while(!isop(*Rover))        // dedicated loop
					add_char(tokn, *Rover++);
				NextToken();
				continue;
				
			default:
				break;
			}
			Rover++;
		}
	}
		
	// check for empty last token
	
	if(!tokn || !tokn[0])
	{
		NumTokens = NumTokens - 1;
	}
	
	Rover++;
	return Rover;
}